

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  long *plVar2;
  pointer pbVar3;
  void *pvVar4;
  ulong uVar5;
  pointer pcVar6;
  MatchResultListener *pMVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  char *sep;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  char *local_78;
  char *local_70;
  vector<char,_std::allocator<char>_> local_68;
  vector<char,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 0;
  local_38 = element_printouts;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_50,*(size_type *)matrix,(value_type *)&local_68,(allocator_type *)&local_78);
  local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68,*(size_type *)(matrix + 8),(value_type *)&local_78,
             (allocator_type *)&local_70);
  if (*(long *)matrix != 0) {
    uVar5 = 0;
    do {
      uVar9 = *(ulong *)(matrix + 8);
      if (uVar9 != 0) {
        uVar8 = 0;
        do {
          bVar11 = *(char *)(uVar8 + uVar9 * uVar5 + *(long *)(matrix + 0x10)) == '\x01';
          local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5] =
               local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5] | bVar11;
          pbVar1 = (byte *)(CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar8);
          *pbVar1 = *pbVar1 | bVar11;
          uVar8 = uVar8 + 1;
          uVar9 = *(ulong *)(matrix + 8);
        } while (uVar8 < uVar9);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(ulong *)matrix);
  }
  bVar11 = true;
  if (((byte)*this & 1) != 0) {
    local_78 = "where the following matchers don\'t match any elements:\n";
    pcVar6 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,
                               local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._0_1_);
    if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish == pcVar6) {
      bVar11 = true;
    }
    else {
      bVar11 = true;
      uVar5 = 0;
      do {
        if (pcVar6[uVar5] == '\0') {
          if (listener->stream_ != (ostream *)0x0) {
            pMVar7 = MatchResultListener::operator<<(listener,&local_78);
            pMVar7 = MatchResultListener::operator<<(pMVar7,(char (*) [10])0x143a7c);
            if (pMVar7->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar7->stream_);
            }
            MatchResultListener::operator<<(pMVar7,(char (*) [3])0x1412ec);
            plVar2 = *(long **)(*(long *)(this + 8) + uVar5 * 8);
            (**(code **)(*plVar2 + 0x10))(plVar2,listener->stream_);
            local_78 = ",\n";
          }
          bVar11 = false;
        }
        uVar5 = uVar5 + 1;
        pcVar6 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,
                                   local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_1_);
      } while (uVar5 < (ulong)((long)local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pcVar6));
    }
  }
  if (((byte)*this & 2) != 0) {
    local_78 = "where the following elements don\'t match any matchers:\n";
    local_70 = "\nand ";
    if (bVar11) {
      local_70 = "";
    }
    if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      lVar10 = 8;
      uVar5 = 0;
      do {
        if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar5] == '\0') {
          if (listener->stream_ != (ostream *)0x0) {
            pMVar7 = MatchResultListener::operator<<(listener,&local_70);
            pMVar7 = MatchResultListener::operator<<(pMVar7,&local_78);
            pMVar7 = MatchResultListener::operator<<(pMVar7,(char (*) [10])0x14383d);
            if (pMVar7->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar7->stream_);
            }
            pMVar7 = MatchResultListener::operator<<(pMVar7,(char (*) [3])0x1412ec);
            if (pMVar7->stream_ != (ostream *)0x0) {
              pbVar3 = (local_38->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar7->stream_,*(char **)((long)pbVar3 + lVar10 + -8),
                         *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10));
            }
            local_78 = ",\n";
            local_70 = "";
          }
          bVar11 = false;
        }
        uVar5 = uVar5 + 1;
        lVar10 = lVar10 + 0x20;
      } while (uVar5 < (ulong)((long)local_50.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                    .super__Vector_impl_data._M_start));
    }
  }
  pvVar4 = (void *)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar11;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}